

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* cmSystemTools::ParseArguments
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *cmd)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  byte *pbVar4;
  byte *pbVar5;
  string arg;
  value_type local_50;
  
  bVar3 = false;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  pbVar4 = (byte *)(cmd->_M_dataplus)._M_p;
  bVar1 = *pbVar4;
  if (bVar1 != 0) {
    bVar2 = pbVar4[1];
    if ((bVar2 == 0) ||
       (((((bVar2 != 0x3a || bVar1 == 0x2f || (pbVar4[2] != 0x5c)) &&
          ((bVar2 == 0x2f || bVar1 != 0x22 || ((pbVar4[2] != 0x3a || (pbVar4[3] != 0x5c)))))) &&
         ((bVar2 == 0x2f || bVar1 != 0x27 || ((pbVar4[2] != 0x3a || (pbVar4[3] != 0x5c)))))) &&
        (bVar2 != 0x5c || bVar1 != 0x5c)))) {
      bVar3 = false;
    }
    else {
      bVar3 = true;
    }
  }
  if (*pbVar4 == 0) {
LAB_001f38c5:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    return __return_storage_ptr__;
  }
LAB_001f376a:
  for (; (*pbVar4 == 0x20 || (*pbVar4 == 9)); pbVar4 = pbVar4 + 1) {
  }
  local_50._M_string_length = 0;
  *local_50._M_dataplus._M_p = '\0';
  bVar1 = *pbVar4;
  if (bVar1 != 0) {
    if (bVar1 == 0x22) {
      while( true ) {
        pbVar5 = pbVar4 + 1;
        bVar1 = *pbVar5;
        if ((bVar1 == 0) || (bVar1 == 0x22)) break;
        std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_50._M_string_length,0,'\x01');
        pbVar4 = pbVar5;
      }
      pbVar4 = pbVar4 + 2;
      if (bVar1 == 0) {
        pbVar4 = pbVar5;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_50);
    }
    else {
      pbVar5 = pbVar4;
      if (bVar1 != 0x27) {
LAB_001f37dd:
        do {
          pbVar4 = pbVar5;
          bVar1 = *pbVar4;
          if (bVar1 == 0x5c) {
            if (!bVar3) {
              pbVar5 = pbVar4 + 1;
              if (pbVar4[1] != 0) {
                std::__cxx11::string::_M_replace_aux
                          ((ulong)&local_50,local_50._M_string_length,0,'\x01');
                pbVar5 = pbVar4 + 2;
              }
              goto LAB_001f37dd;
            }
          }
          else if ((bVar1 < 0x21) && ((0x100000201U >> ((ulong)bVar1 & 0x3f) & 1) != 0))
          goto LAB_001f38ad;
          std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_50._M_string_length,0,'\x01');
          pbVar5 = pbVar4 + 1;
        } while( true );
      }
      while( true ) {
        pbVar5 = pbVar4 + 1;
        bVar1 = *pbVar5;
        if ((bVar1 == 0) || (bVar1 == 0x27)) break;
        std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_50._M_string_length,0,'\x01');
        pbVar4 = pbVar5;
      }
      pbVar4 = pbVar4 + 2;
      if (bVar1 == 0) {
        pbVar4 = pbVar5;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_50);
    }
  }
  goto LAB_001f38b8;
LAB_001f38ad:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_50);
LAB_001f38b8:
  if (*pbVar4 == 0) goto LAB_001f38c5;
  goto LAB_001f376a;
}

Assistant:

std::vector<std::string> cmSystemTools::ParseArguments(const std::string& cmd)
{
  std::vector<std::string> args;
  std::string arg;

  bool win_path = false;

  const char* command = cmd.c_str();
  if (command[0] && command[1] &&
      ((command[0] != '/' && command[1] == ':' && command[2] == '\\') ||
       (command[0] == '\"' && command[1] != '/' && command[2] == ':' &&
        command[3] == '\\') ||
       (command[0] == '\'' && command[1] != '/' && command[2] == ':' &&
        command[3] == '\\') ||
       (command[0] == '\\' && command[1] == '\\'))) {
    win_path = true;
  }
  // Split the command into an argv array.
  for (const char* c = command; *c;) {
    // Skip over whitespace.
    while (*c == ' ' || *c == '\t') {
      ++c;
    }
    arg.clear();
    if (*c == '"') {
      // Parse a quoted argument.
      ++c;
      while (*c && *c != '"') {
        arg.append(1, *c);
        ++c;
      }
      if (*c) {
        ++c;
      }
      args.push_back(arg);
    } else if (*c == '\'') {
      // Parse a quoted argument.
      ++c;
      while (*c && *c != '\'') {
        arg.append(1, *c);
        ++c;
      }
      if (*c) {
        ++c;
      }
      args.push_back(arg);
    } else if (*c) {
      // Parse an unquoted argument.
      while (*c && *c != ' ' && *c != '\t') {
        if (*c == '\\' && !win_path) {
          ++c;
          if (*c) {
            arg.append(1, *c);
            ++c;
          }
        } else {
          arg.append(1, *c);
          ++c;
        }
      }
      args.push_back(arg);
    }
  }

  return args;
}